

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_rol_a_c_set_clears_c_and_z_flags_Test::
~CpuTest_rol_a_c_set_clears_c_and_z_flags_Test(CpuTest_rol_a_c_set_clears_c_and_z_flags_Test *this)

{
  CpuTest_rol_a_c_set_clears_c_and_z_flags_Test *this_local;
  
  ~CpuTest_rol_a_c_set_clears_c_and_z_flags_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, rol_a_c_set_clears_c_and_z_flags) {
    stage_instruction(ROL_ACC);
    registers.a = 0b00000000;
    registers.p = C_FLAG;
    expected.a = 0b00000001;
    expected.p = 0;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}